

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse-2-typedefs.cpp
# Opt level: O1

Result<wasm::Ok> *
wasm::WATParser::parseTypeDefs
          (Result<wasm::Ok> *__return_storage_ptr__,ParseDeclsCtx *decls,Lexer *input,
          IndexMap *typeIndices,vector<wasm::HeapType,_std::allocator<wasm::HeapType>_> *types,
          unordered_map<wasm::HeapType,_std::unordered_map<wasm::Name,_unsigned_int,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_unsigned_int>_>_>,_std::hash<wasm::HeapType>,_std::equal_to<wasm::HeapType>,_std::allocator<std::pair<const_wasm::HeapType,_std::unordered_map<wasm::Name,_unsigned_int,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_unsigned_int>_>_>_>_>_>
          *typeNames)

{
  undefined8 *puVar1;
  TypeBuilder *pTVar2;
  uint uVar3;
  pointer pDVar4;
  Module *pMVar5;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar6;
  size_type sVar7;
  TypeBuilder TVar8;
  variant_alternative_t<0UL,_variant<vector<HeapType,_allocator<HeapType>_>,_Error>_> *__x;
  long lVar9;
  _Hashtable<wasm::Name,std::pair<wasm::Name_const,unsigned_int>,std::allocator<std::pair<wasm::Name_const,unsigned_int>>,std::__detail::_Select1st,std::equal_to<wasm::Name>,std::hash<wasm::Name>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
  *p_Var10;
  _Head_base<0UL,_wasm::TypeBuilder::Impl_*,_false> _Var11;
  ulong uVar12;
  pointer pDVar13;
  __hashtable *__h;
  undefined1 auStack_2d8 [8];
  WithPosition<wasm::WATParser::ParseTypeDefsCtx> with;
  ios_base local_258 [264];
  undefined1 local_150 [8];
  ParseTypeDefsCtx ctx;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_b8;
  _Map_base<wasm::HeapType,_std::pair<const_wasm::HeapType,_std::unordered_map<wasm::Name,_unsigned_int,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_unsigned_int>_>_>_>,_std::allocator<std::pair<const_wasm::HeapType,_std::unordered_map<wasm::Name,_unsigned_int,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_unsigned_int>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<wasm::HeapType>,_std::hash<wasm::HeapType>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
  *local_a8;
  undefined1 local_a0 [8];
  BuildResult built;
  TypeBuilder local_70;
  TypeBuilder builder;
  Err local_58;
  
  local_a8 = (_Map_base<wasm::HeapType,_std::pair<const_wasm::HeapType,_std::unordered_map<wasm::Name,_unsigned_int,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_unsigned_int>_>_>_>,_std::allocator<std::pair<const_wasm::HeapType,_std::unordered_map<wasm::Name,_unsigned_int,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_unsigned_int>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<wasm::HeapType>,_std::hash<wasm::HeapType>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
              *)typeNames;
  builder.impl._M_t.
  super___uniq_ptr_impl<wasm::TypeBuilder::Impl,_std::default_delete<wasm::TypeBuilder::Impl>_>._M_t
  .super__Tuple_impl<0UL,_wasm::TypeBuilder::Impl_*,_std::default_delete<wasm::TypeBuilder::Impl>_>.
  super__Head_base<0UL,_wasm::TypeBuilder::Impl_*,_false>._M_head_impl =
       (unique_ptr<wasm::TypeBuilder::Impl,_std::default_delete<wasm::TypeBuilder::Impl>_>)
       (unique_ptr<wasm::TypeBuilder::Impl,_std::default_delete<wasm::TypeBuilder::Impl>_>)types;
  TypeBuilder::TypeBuilder
            (&local_70,
             ((long)(decls->typeDefs).
                    super__Vector_base<wasm::WATParser::DefPos,_std::allocator<wasm::WATParser::DefPos>_>
                    ._M_impl.super__Vector_impl_data._M_finish -
              (long)(decls->typeDefs).
                    super__Vector_base<wasm::WATParser::DefPos,_std::allocator<wasm::WATParser::DefPos>_>
                    ._M_impl.super__Vector_impl_data._M_start >> 4) * -0x5555555555555555);
  ParseTypeDefsCtx::ParseTypeDefsCtx((ParseTypeDefsCtx *)local_150,input,&local_70,typeIndices);
  pDVar13 = (decls->recTypeDefs).
            super__Vector_base<wasm::WATParser::DefPos,_std::allocator<wasm::WATParser::DefPos>_>.
            _M_impl.super__Vector_impl_data._M_start;
  pDVar4 = (decls->recTypeDefs).
           super__Vector_base<wasm::WATParser::DefPos,_std::allocator<wasm::WATParser::DefPos>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  if (pDVar13 != pDVar4) {
    do {
      WithPosition<wasm::WATParser::ParseTypeDefsCtx>::WithPosition
                ((WithPosition<wasm::WATParser::ParseTypeDefsCtx> *)auStack_2d8,
                 (ParseTypeDefsCtx *)local_150,pDVar13->pos);
      rectype<wasm::WATParser::ParseTypeDefsCtx>
                ((MaybeResult<wasm::Ok> *)local_a0,(ParseTypeDefsCtx *)local_150);
      if (built.
          super_variant<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_wasm::TypeBuilder::Error>
          .
          super__Variant_base<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_wasm::TypeBuilder::Error>
          .super__Move_assign_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
          super__Copy_assign_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
          super__Move_ctor_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
          super__Copy_ctor_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
          super__Variant_storage_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
          _M_index == '\x02') {
        paVar6 = &local_58.msg.field_2;
        local_58.msg._M_dataplus._M_p = (pointer)paVar6;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_58,local_a0,
                   built.
                   super_variant<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_wasm::TypeBuilder::Error>
                   .
                   super__Variant_base<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_wasm::TypeBuilder::Error>
                   .super__Move_assign_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
                   super__Copy_assign_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
                   super__Move_ctor_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
                   super__Copy_ctor_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
                   super__Variant_storage_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>
                   ._M_u._0_8_ + (long)local_a0);
        puVar1 = (undefined8 *)
                 ((long)&(__return_storage_ptr__->val).super__Variant_base<wasm::Ok,_wasm::Err>.
                         super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                         super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                         super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                         super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
                         super__Variant_storage_alias<wasm::Ok,_wasm::Err>._M_u + 0x10);
        *(undefined8 **)
         &(__return_storage_ptr__->val).super__Variant_base<wasm::Ok,_wasm::Err>.
          super__Move_assign_alias<wasm::Ok,_wasm::Err>.
          super__Copy_assign_alias<wasm::Ok,_wasm::Err>.super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
          super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
          super__Variant_storage_alias<wasm::Ok,_wasm::Err> = puVar1;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_58.msg._M_dataplus._M_p == paVar6) {
          *puVar1 = CONCAT44(local_58.msg.field_2._M_allocated_capacity._4_4_,
                             local_58.msg.field_2._M_allocated_capacity._0_4_);
          *(undefined8 *)
           ((long)&(__return_storage_ptr__->val).super__Variant_base<wasm::Ok,_wasm::Err>.
                   super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                   super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                   super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                   super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
                   super__Variant_storage_alias<wasm::Ok,_wasm::Err>._M_u + 0x18) =
               local_58.msg.field_2._8_8_;
        }
        else {
          *(pointer *)
           &(__return_storage_ptr__->val).super__Variant_base<wasm::Ok,_wasm::Err>.
            super__Move_assign_alias<wasm::Ok,_wasm::Err>.
            super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
            super__Move_ctor_alias<wasm::Ok,_wasm::Err>.super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
            super__Variant_storage_alias<wasm::Ok,_wasm::Err> = local_58.msg._M_dataplus._M_p;
          *(ulong *)((long)&(__return_storage_ptr__->val).super__Variant_base<wasm::Ok,_wasm::Err>.
                            super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                            super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                            super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                            super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
                            super__Variant_storage_alias<wasm::Ok,_wasm::Err>._M_u + 0x10) =
               CONCAT44(local_58.msg.field_2._M_allocated_capacity._4_4_,
                        local_58.msg.field_2._M_allocated_capacity._0_4_);
        }
        *(size_type *)
         ((long)&(__return_storage_ptr__->val).super__Variant_base<wasm::Ok,_wasm::Err>.
                 super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                 super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                 super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                 super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
                 super__Variant_storage_alias<wasm::Ok,_wasm::Err>._M_u + 8) =
             local_58.msg._M_string_length;
        local_58.msg._M_string_length = 0;
        local_58.msg.field_2._M_allocated_capacity._0_4_ =
             local_58.msg.field_2._M_allocated_capacity._0_4_ & 0xffffff00;
        (__return_storage_ptr__->val).super__Variant_base<wasm::Ok,_wasm::Err>.
        super__Move_assign_alias<wasm::Ok,_wasm::Err>.super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
        super__Move_ctor_alias<wasm::Ok,_wasm::Err>.super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
        super__Variant_storage_alias<wasm::Ok,_wasm::Err>._M_index = '\x01';
        local_58.msg._M_dataplus._M_p = (pointer)paVar6;
        std::__detail::__variant::_Variant_storage<false,_wasm::Ok,_wasm::None,_wasm::Err>::
        ~_Variant_storage((_Variant_storage<false,_wasm::Ok,_wasm::None,_wasm::Err> *)local_a0);
        WithPosition<wasm::WATParser::ParseTypeDefsCtx>::~WithPosition
                  ((WithPosition<wasm::WATParser::ParseTypeDefsCtx> *)auStack_2d8);
        goto LAB_00bccb77;
      }
      std::__detail::__variant::_Variant_storage<false,_wasm::Ok,_wasm::None,_wasm::Err>::
      ~_Variant_storage((_Variant_storage<false,_wasm::Ok,_wasm::None,_wasm::Err> *)local_a0);
      WithPosition<wasm::WATParser::ParseTypeDefsCtx>::~WithPosition
                ((WithPosition<wasm::WATParser::ParseTypeDefsCtx> *)auStack_2d8);
      pDVar13 = pDVar13 + 1;
    } while (pDVar13 != pDVar4);
  }
  TypeBuilder::build((BuildResult *)local_a0,&local_70);
  if (built.
      super_variant<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_wasm::TypeBuilder::Error>
      .
      super__Variant_base<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_wasm::TypeBuilder::Error>
      .super__Move_assign_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
      super__Copy_assign_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
      super__Move_ctor_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
      super__Copy_ctor_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
      super__Variant_storage_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>._M_u.
      _M_first._M_storage._M_storage[0x10] == '\x01') {
    std::__cxx11::stringstream::stringstream((stringstream *)auStack_2d8);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&with.original,"invalid type: ",0xe);
    wasm::operator<<((ostream *)&with.original,
                     built.
                     super_variant<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_wasm::TypeBuilder::Error>
                     .
                     super__Variant_base<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_wasm::TypeBuilder::Error>
                     .
                     super__Move_assign_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>
                     .
                     super__Copy_assign_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>
                     .super__Move_ctor_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
                     super__Copy_ctor_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
                     super__Variant_storage_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>
                     ._M_u._0_4_);
    uVar3 = (decls->typeDefs).
            super__Vector_base<wasm::WATParser::DefPos,_std::allocator<wasm::WATParser::DefPos>_>.
            _M_impl.super__Vector_impl_data._M_start[(long)local_a0].pos;
    std::__cxx11::stringbuf::str();
    Lexer::err(&local_58,(Lexer *)&ctx,(ulong)uVar3,(string *)&ctx.index);
    puVar1 = (undefined8 *)
             ((long)&(__return_storage_ptr__->val).super__Variant_base<wasm::Ok,_wasm::Err>.
                     super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                     super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                     super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                     super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
                     super__Variant_storage_alias<wasm::Ok,_wasm::Err>._M_u + 0x10);
    *(undefined8 **)
     &(__return_storage_ptr__->val).super__Variant_base<wasm::Ok,_wasm::Err>.
      super__Move_assign_alias<wasm::Ok,_wasm::Err>.super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
      super__Move_ctor_alias<wasm::Ok,_wasm::Err>.super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
      super__Variant_storage_alias<wasm::Ok,_wasm::Err> = puVar1;
    paVar6 = &local_58.msg.field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_58.msg._M_dataplus._M_p == paVar6) {
      *puVar1 = CONCAT44(local_58.msg.field_2._M_allocated_capacity._4_4_,
                         local_58.msg.field_2._M_allocated_capacity._0_4_);
      *(undefined8 *)
       ((long)&(__return_storage_ptr__->val).super__Variant_base<wasm::Ok,_wasm::Err>.
               super__Move_assign_alias<wasm::Ok,_wasm::Err>.
               super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
               super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
               super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
               super__Variant_storage_alias<wasm::Ok,_wasm::Err>._M_u + 0x18) =
           local_58.msg.field_2._8_8_;
    }
    else {
      *(pointer *)
       &(__return_storage_ptr__->val).super__Variant_base<wasm::Ok,_wasm::Err>.
        super__Move_assign_alias<wasm::Ok,_wasm::Err>.super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
        super__Move_ctor_alias<wasm::Ok,_wasm::Err>.super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
        super__Variant_storage_alias<wasm::Ok,_wasm::Err> = local_58.msg._M_dataplus._M_p;
      *(ulong *)((long)&(__return_storage_ptr__->val).super__Variant_base<wasm::Ok,_wasm::Err>.
                        super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                        super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                        super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                        super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
                        super__Variant_storage_alias<wasm::Ok,_wasm::Err>._M_u + 0x10) =
           CONCAT44(local_58.msg.field_2._M_allocated_capacity._4_4_,
                    local_58.msg.field_2._M_allocated_capacity._0_4_);
    }
    *(size_type *)
     ((long)&(__return_storage_ptr__->val).super__Variant_base<wasm::Ok,_wasm::Err>.
             super__Move_assign_alias<wasm::Ok,_wasm::Err>.
             super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
             super__Move_ctor_alias<wasm::Ok,_wasm::Err>.super__Copy_ctor_alias<wasm::Ok,_wasm::Err>
             .super__Variant_storage_alias<wasm::Ok,_wasm::Err>._M_u + 8) =
         local_58.msg._M_string_length;
    local_58.msg._M_string_length = 0;
    local_58.msg.field_2._M_allocated_capacity._0_4_ =
         local_58.msg.field_2._M_allocated_capacity._0_4_ & 0xffffff00;
    (__return_storage_ptr__->val).super__Variant_base<wasm::Ok,_wasm::Err>.
    super__Move_assign_alias<wasm::Ok,_wasm::Err>.super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
    super__Move_ctor_alias<wasm::Ok,_wasm::Err>.super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
    super__Variant_storage_alias<wasm::Ok,_wasm::Err>._M_index = '\x01';
    local_58.msg._M_dataplus._M_p = (pointer)paVar6;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)ctx._128_8_ != &local_b8) {
      operator_delete((void *)ctx._128_8_,local_b8._M_allocated_capacity + 1);
    }
    std::__cxx11::stringstream::~stringstream((stringstream *)auStack_2d8);
    std::ios_base::~ios_base(local_258);
  }
  else {
    __x = std::
          get<0ul,std::vector<wasm::HeapType,std::allocator<wasm::HeapType>>,wasm::TypeBuilder::Error>
                    ((variant<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_wasm::TypeBuilder::Error>
                      *)local_a0);
    TVar8 = builder;
    std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>::operator=
              ((vector<wasm::HeapType,_std::allocator<wasm::HeapType>_> *)
               builder.impl._M_t.
               super___uniq_ptr_impl<wasm::TypeBuilder::Impl,_std::default_delete<wasm::TypeBuilder::Impl>_>
               ._M_t.
               super__Tuple_impl<0UL,_wasm::TypeBuilder::Impl_*,_std::default_delete<wasm::TypeBuilder::Impl>_>
               .super__Head_base<0UL,_wasm::TypeBuilder::Impl_*,_false>._M_head_impl,__x);
    lVar9 = *(long *)TVar8.impl._M_t.
                     super___uniq_ptr_impl<wasm::TypeBuilder::Impl,_std::default_delete<wasm::TypeBuilder::Impl>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_wasm::TypeBuilder::Impl_*,_std::default_delete<wasm::TypeBuilder::Impl>_>
                     .super__Head_base<0UL,_wasm::TypeBuilder::Impl_*,_false>._M_head_impl;
    if (*(long *)((long)TVar8.impl._M_t.
                        super___uniq_ptr_impl<wasm::TypeBuilder::Impl,_std::default_delete<wasm::TypeBuilder::Impl>_>
                        ._M_t.
                        super__Tuple_impl<0UL,_wasm::TypeBuilder::Impl_*,_std::default_delete<wasm::TypeBuilder::Impl>_>
                        .super__Head_base<0UL,_wasm::TypeBuilder::Impl_*,_false>._M_head_impl + 8)
        != lVar9) {
      uVar12 = 0;
      do {
        pTVar2 = ctx.builder + uVar12 * 9;
        if ((pTVar2[1].impl._M_t.
             super___uniq_ptr_impl<wasm::TypeBuilder::Impl,_std::default_delete<wasm::TypeBuilder::Impl>_>
             ._M_t.
             super__Tuple_impl<0UL,_wasm::TypeBuilder::Impl_*,_std::default_delete<wasm::TypeBuilder::Impl>_>
             .super__Head_base<0UL,_wasm::TypeBuilder::Impl_*,_false>._M_head_impl != (Impl *)0x0)
           || (pTVar2[5].impl._M_t.
               super___uniq_ptr_impl<wasm::TypeBuilder::Impl,_std::default_delete<wasm::TypeBuilder::Impl>_>
               ._M_t.
               super__Tuple_impl<0UL,_wasm::TypeBuilder::Impl_*,_std::default_delete<wasm::TypeBuilder::Impl>_>
               .super__Head_base<0UL,_wasm::TypeBuilder::Impl_*,_false>._M_head_impl != (Impl *)0x0)
           ) {
          pMVar5 = decls->wasm;
          auStack_2d8 = *(undefined1 (*) [8])(lVar9 + uVar12 * 8);
          with.ctx = (ParseTypeDefsCtx *)
                     (pTVar2->impl)._M_t.
                     super___uniq_ptr_impl<wasm::TypeBuilder::Impl,_std::default_delete<wasm::TypeBuilder::Impl>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_wasm::TypeBuilder::Impl_*,_std::default_delete<wasm::TypeBuilder::Impl>_>
                     .super__Head_base<0UL,_wasm::TypeBuilder::Impl_*,_false>._M_head_impl;
          with._8_8_ = pTVar2[1].impl._M_t.
                       super___uniq_ptr_impl<wasm::TypeBuilder::Impl,_std::default_delete<wasm::TypeBuilder::Impl>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_wasm::TypeBuilder::Impl_*,_std::default_delete<wasm::TypeBuilder::Impl>_>
                       .super__Head_base<0UL,_wasm::TypeBuilder::Impl_*,_false>._M_head_impl;
          with.annotations.
          super__Vector_base<wasm::WATParser::Annotation,_std::allocator<wasm::WATParser::Annotation>_>
          ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
          with.annotations.
          super__Vector_base<wasm::WATParser::Annotation,_std::allocator<wasm::WATParser::Annotation>_>
          ._M_impl.super__Vector_impl_data._M_finish =
               (pointer)pTVar2[3].impl._M_t.
                        super___uniq_ptr_impl<wasm::TypeBuilder::Impl,_std::default_delete<wasm::TypeBuilder::Impl>_>
                        ._M_t.
                        super__Tuple_impl<0UL,_wasm::TypeBuilder::Impl_*,_std::default_delete<wasm::TypeBuilder::Impl>_>
                        .super__Head_base<0UL,_wasm::TypeBuilder::Impl_*,_false>._M_head_impl;
          with.annotations.
          super__Vector_base<wasm::WATParser::Annotation,_std::allocator<wasm::WATParser::Annotation>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          local_58.msg._M_dataplus._M_p = (pointer)&with.annotations;
          std::
          _Hashtable<unsigned_int,std::pair<unsigned_int_const,wasm::Name>,std::allocator<std::pair<unsigned_int_const,wasm::Name>>,std::__detail::_Select1st,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
          ::
          _M_assign<std::_Hashtable<unsigned_int,std::pair<unsigned_int_const,wasm::Name>,std::allocator<std::pair<unsigned_int_const,wasm::Name>>,std::__detail::_Select1st,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>const&,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<std::pair<unsigned_int_const,wasm::Name>,false>>>>
                    ((_Hashtable<unsigned_int,std::pair<unsigned_int_const,wasm::Name>,std::allocator<std::pair<unsigned_int_const,wasm::Name>>,std::__detail::_Select1st,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
                      *)local_58.msg._M_dataplus._M_p,
                     (_Hashtable<unsigned_int,_std::pair<const_unsigned_int,_wasm::Name>,_std::allocator<std::pair<const_unsigned_int,_wasm::Name>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                      *)(ctx.builder + uVar12 * 9 + 2),
                     (_AllocNode<std::allocator<std::__detail::_Hash_node<std::pair<const_unsigned_int,_wasm::Name>,_false>_>_>
                      *)&local_58);
          std::
          _Hashtable<wasm::HeapType,std::pair<wasm::HeapType_const,wasm::TypeNames>,std::allocator<std::pair<wasm::HeapType_const,wasm::TypeNames>>,std::__detail::_Select1st,std::equal_to<wasm::HeapType>,std::hash<wasm::HeapType>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
          ::_M_emplace<std::pair<wasm::HeapType_const,wasm::TypeNames>>
                    ((_Hashtable<wasm::HeapType,std::pair<wasm::HeapType_const,wasm::TypeNames>,std::allocator<std::pair<wasm::HeapType_const,wasm::TypeNames>>,std::__detail::_Select1st,std::equal_to<wasm::HeapType>,std::hash<wasm::HeapType>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
                      *)&pMVar5->typeNames,auStack_2d8);
          std::
          _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_wasm::Name>,_std::allocator<std::pair<const_unsigned_int,_wasm::Name>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
          ::~_Hashtable((_Hashtable<unsigned_int,_std::pair<const_unsigned_int,_wasm::Name>,_std::allocator<std::pair<const_unsigned_int,_wasm::Name>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                         *)&with.annotations);
          p_Var10 = (_Hashtable<wasm::Name,std::pair<wasm::Name_const,unsigned_int>,std::allocator<std::pair<wasm::Name_const,unsigned_int>>,std::__detail::_Select1st,std::equal_to<wasm::Name>,std::hash<wasm::Name>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
                     *)std::__detail::
                       _Map_base<wasm::HeapType,_std::pair<const_wasm::HeapType,_std::unordered_map<wasm::Name,_unsigned_int,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_unsigned_int>_>_>_>,_std::allocator<std::pair<const_wasm::HeapType,_std::unordered_map<wasm::Name,_unsigned_int,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_unsigned_int>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<wasm::HeapType>,_std::hash<wasm::HeapType>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                       ::operator[](local_a8,(key_type *)
                                             (uVar12 * 8 +
                                             *(long *)builder.impl._M_t.
                                                                                                            
                                                  super___uniq_ptr_impl<wasm::TypeBuilder::Impl,_std::default_delete<wasm::TypeBuilder::Impl>_>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_wasm::TypeBuilder::Impl_*,_std::default_delete<wasm::TypeBuilder::Impl>_>
                                                  .
                                                  super__Head_base<0UL,_wasm::TypeBuilder::Impl_*,_false>
                                                  ._M_head_impl));
          for (_Var11._M_head_impl =
                    pTVar2[4].impl._M_t.
                    super___uniq_ptr_impl<wasm::TypeBuilder::Impl,_std::default_delete<wasm::TypeBuilder::Impl>_>
                    ._M_t.
                    super__Tuple_impl<0UL,_wasm::TypeBuilder::Impl_*,_std::default_delete<wasm::TypeBuilder::Impl>_>
                    .super__Head_base<0UL,_wasm::TypeBuilder::Impl_*,_false>._M_head_impl;
              _Var11._M_head_impl != (Impl *)0x0;
              _Var11._M_head_impl = *(Impl **)&((_Var11._M_head_impl)->tupleStore).mutex) {
            local_58.msg.field_2._M_allocated_capacity._0_4_ =
                 *(undefined4 *)
                  ((long)&((_Var11._M_head_impl)->tupleStore).mutex.super___recursive_mutex_base.
                          _M_mutex + 0x1c);
            paVar6 = *(anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       **)((long)&((_Var11._M_head_impl)->tupleStore).mutex.
                                  super___recursive_mutex_base._M_mutex + 0xc);
            sVar7 = *(size_type *)
                     ((long)&((_Var11._M_head_impl)->tupleStore).mutex.super___recursive_mutex_base.
                             _M_mutex + 0x14);
            local_58.msg._M_dataplus._M_p._4_4_ = (undefined4)((ulong)paVar6 >> 0x20);
            local_58.msg._M_string_length._0_4_ = (undefined4)sVar7;
            local_58.msg._M_string_length._4_4_ = (undefined4)(sVar7 >> 0x20);
            auStack_2d8._4_4_ = (undefined4)local_58.msg._M_string_length;
            auStack_2d8._0_4_ = local_58.msg._M_dataplus._M_p._4_4_;
            with.ctx = (ParseTypeDefsCtx *)
                       CONCAT44(local_58.msg.field_2._M_allocated_capacity._0_4_,
                                local_58.msg._M_string_length._4_4_);
            with.original =
                 ((_Var11._M_head_impl)->tupleStore).mutex.super___recursive_mutex_base._M_mutex.
                 __data.__owner;
            local_58.msg._M_dataplus._M_p = (pointer)paVar6;
            local_58.msg._M_string_length = sVar7;
            std::
            _Hashtable<wasm::Name,std::pair<wasm::Name_const,unsigned_int>,std::allocator<std::pair<wasm::Name_const,unsigned_int>>,std::__detail::_Select1st,std::equal_to<wasm::Name>,std::hash<wasm::Name>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
            ::_M_emplace<std::pair<wasm::Name_const,unsigned_int>>(p_Var10,auStack_2d8);
          }
        }
        uVar12 = uVar12 + 1;
        lVar9 = *(long *)builder.impl._M_t.
                         super___uniq_ptr_impl<wasm::TypeBuilder::Impl,_std::default_delete<wasm::TypeBuilder::Impl>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_wasm::TypeBuilder::Impl_*,_std::default_delete<wasm::TypeBuilder::Impl>_>
                         .super__Head_base<0UL,_wasm::TypeBuilder::Impl_*,_false>._M_head_impl;
      } while (uVar12 < (ulong)(*(long *)((long)builder.impl._M_t.
                                                super___uniq_ptr_impl<wasm::TypeBuilder::Impl,_std::default_delete<wasm::TypeBuilder::Impl>_>
                                                ._M_t.
                                                super__Tuple_impl<0UL,_wasm::TypeBuilder::Impl_*,_std::default_delete<wasm::TypeBuilder::Impl>_>
                                                .
                                                super__Head_base<0UL,_wasm::TypeBuilder::Impl_*,_false>
                                                ._M_head_impl + 8) - lVar9 >> 3));
    }
    (__return_storage_ptr__->val).super__Variant_base<wasm::Ok,_wasm::Err>.
    super__Move_assign_alias<wasm::Ok,_wasm::Err>.super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
    super__Move_ctor_alias<wasm::Ok,_wasm::Err>.super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
    super__Variant_storage_alias<wasm::Ok,_wasm::Err>._M_index = '\0';
  }
  (*std::__detail::__variant::
    __gen_vtable<void,_(lambda_at_/usr/lib/gcc/x86_64-linux-gnu/11/../../../../include/c++/11/variant:427:24)_&&,_std::variant<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_wasm::TypeBuilder::Error>_&>
    ::_S_vtable._M_arr
    [built.
     super_variant<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_wasm::TypeBuilder::Error>
     .
     super__Variant_base<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_wasm::TypeBuilder::Error>
     .super__Move_assign_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
     super__Copy_assign_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
     super__Move_ctor_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
     super__Copy_ctor_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
     super__Variant_storage_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>._M_u.
     _M_first._M_storage._M_storage[0x10]]._M_data)
            ((anon_class_1_0_00000001 *)auStack_2d8,
             (variant<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_wasm::TypeBuilder::Error>
              *)local_a0);
LAB_00bccb77:
  std::vector<wasm::TypeNames,_std::allocator<wasm::TypeNames>_>::~vector
            ((vector<wasm::TypeNames,_std::allocator<wasm::TypeNames>_> *)&ctx.builder);
  if ((ctx.in.file.
       super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
       ._M_payload.
       super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
       .
       super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
       ._M_payload._24_1_ == '\x01') &&
     (ctx.in.file.
      super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
      ._M_payload.
      super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
      .
      super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ._M_payload._24_1_ = 0,
     ctx.in.annotations.
     super__Vector_base<wasm::WATParser::Annotation,_std::allocator<wasm::WATParser::Annotation>_>.
     _M_impl.super__Vector_impl_data._M_end_of_storage !=
     (pointer)((long)&ctx.in.file.
                      super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
                      ._M_payload.
                      super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
                      .
                      super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      ._M_payload + 8))) {
    operator_delete(ctx.in.annotations.
                    super__Vector_base<wasm::WATParser::Annotation,_std::allocator<wasm::WATParser::Annotation>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage,
                    ctx.in.file.
                    super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
                    ._M_payload.
                    super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
                    .
                    super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    ._M_payload._M_value._M_string_length + 1);
  }
  if (ctx.in.pos != 0) {
    operator_delete((void *)ctx.in.pos,
                    (long)ctx.in.annotations.
                          super__Vector_base<wasm::WATParser::Annotation,_std::allocator<wasm::WATParser::Annotation>_>
                          ._M_impl.super__Vector_impl_data._M_finish - ctx.in.pos);
  }
  TypeBuilder::~TypeBuilder(&local_70);
  return __return_storage_ptr__;
}

Assistant:

Result<> parseTypeDefs(
  ParseDeclsCtx& decls,
  Lexer& input,
  IndexMap& typeIndices,
  std::vector<HeapType>& types,
  std::unordered_map<HeapType, std::unordered_map<Name, Index>>& typeNames) {
  TypeBuilder builder(decls.typeDefs.size());
  ParseTypeDefsCtx ctx(input, builder, typeIndices);
  for (auto& recType : decls.recTypeDefs) {
    WithPosition with(ctx, recType.pos);
    CHECK_ERR(rectype(ctx));
  }
  auto built = builder.build();
  if (auto* err = built.getError()) {
    std::stringstream msg;
    msg << "invalid type: " << err->reason;
    return ctx.in.err(decls.typeDefs[err->index].pos, msg.str());
  }
  types = *built;
  // Record type names on the module and in typeNames.
  for (size_t i = 0; i < types.size(); ++i) {
    auto& names = ctx.names[i];
    auto& fieldNames = names.fieldNames;
    if (names.name.is() || fieldNames.size()) {
      decls.wasm.typeNames.insert({types[i], names});
      auto& fieldIdxMap = typeNames[types[i]];
      for (auto [idx, name] : fieldNames) {
        fieldIdxMap.insert({name, idx});
      }
    }
  }
  return Ok{};
}